

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O3

void Gyroid(void)

{
  undefined8 in_RDI;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 uStack_18;
  undefined8 uStack_10;
  
  local_58 = 0;
  uStack_50 = 0;
  local_40 = std::_Function_handler<double_(linalg::vec<double,_3>),_GyroidSDF>::_M_invoke;
  local_48 = std::_Function_handler<double_(linalg::vec<double,_3>),_GyroidSDF>::_M_manager;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0x401921fb54442d18;
  uStack_18 = 0x401921fb54442d18;
  uStack_10 = 0x401921fb54442d18;
  manifold::Manifold::LevelSet(0,0,0,in_RDI,&local_58,1);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return;
}

Assistant:

Manifold Gyroid() {
  const double period = kTwoPi;
  return Manifold::LevelSet(GyroidSDF(), {vec3(0.0), vec3(period)}, 0.5);
}